

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O2

uint32_t __thiscall GmmLib::GmmResourceInfoCommon::GetQPitch(GmmResourceInfoCommon *this)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  GMM_PLATFORM_INFO *pGVar6;
  undefined4 extraout_var_00;
  
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pGVar6 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var,iVar2));
  if (0xb < (int)(pGVar6->Platform).eRenderCoreFamily) {
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    uVar1 = GmmIsCompressed((void *)CONCAT44(extraout_var_00,iVar2),(this->Surf).Format);
    if (uVar1 != '\0') {
      uVar4 = (this->Surf).Alignment.QPitch;
      uVar3 = (*this->_vptr_GmmResourceInfoCommon[0x7d])(this);
      uVar4 = uVar4 / uVar3;
      if ((this->Surf).Type != RESOURCE_3D) {
        return uVar4;
      }
      if (((this->Surf).Flags.Info.field_0x2 & 8) != 0) {
        return uVar4;
      }
      uVar5 = pGVar6->TileInfo[(this->Surf).TileMode].LogicalTileHeight;
      return -uVar5 & (uVar4 - 1) + uVar5;
    }
  }
  uVar5 = (this->Surf).Alignment.QPitch;
  if (((this->Surf).Flags.Gpu.field_0x1 & 4) != 0) {
    uVar5 = uVar5 * pGVar6->HiZPixelsPerByte;
  }
  return uVar5;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetQPitch()
{
    const GMM_PLATFORM_INFO *pPlatform;
    uint32_t                 QPitch;

    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());

    __GMM_ASSERT(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE);
    __GMM_ASSERT((Surf.Type != RESOURCE_3D) ||
                 (GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE));

    // 2D/CUBE    ==> distance in rows between array slices
    // 3D         ==> distance in rows between R-slices
    // Compressed ==> one row contains a complete compression block vertically
    // HiZ        ==> HZ_PxPerByte * HZ_QPitch
    // Stencil    ==> logical, i.e. not halved

    if((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE) &&
       GmmIsCompressed(GetGmmLibContext(), Surf.Format))
    {
        QPitch = Surf.Alignment.QPitch / GetCompressionBlockHeight();

        if((Surf.Type == RESOURCE_3D) && !Surf.Flags.Info.Linear)
        {
            const GMM_TILE_MODE TileMode = Surf.TileMode;
            __GMM_ASSERT(TileMode < GMM_TILE_MODES);
            QPitch = GFX_ALIGN(QPitch, pPlatform->TileInfo[TileMode].LogicalTileHeight);
        }
    }
    else if(Surf.Flags.Gpu.HiZ)
    {
        QPitch = Surf.Alignment.QPitch * pPlatform->HiZPixelsPerByte;
    }
    else
    {
        QPitch = Surf.Alignment.QPitch;
    }

    return QPitch;
}